

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoding_backend_init_file__wav
                    (void *pUserData,char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_wav *pWav;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pWav = (ma_wav *)malloc(0x200);
  }
  else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    pWav = (ma_wav *)0x0;
  }
  else {
    pWav = (ma_wav *)(*pAllocationCallbacks->onMalloc)(0x200,pAllocationCallbacks->pUserData);
  }
  if (pWav == (ma_wav *)0x0) {
    mVar1 = MA_OUT_OF_MEMORY;
  }
  else {
    mVar1 = ma_wav_init_file(pFilePath,pConfig,pAllocationCallbacks,pWav);
    if (mVar1 == MA_SUCCESS) {
      *ppBackend = pWav;
      mVar1 = MA_SUCCESS;
    }
    else if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      free(pWav);
    }
    else if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
      (*pAllocationCallbacks->onFree)(pWav,pAllocationCallbacks->pUserData);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init_file__wav(void* pUserData, const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_wav* pWav;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pWav = (ma_wav*)ma_malloc(sizeof(*pWav), pAllocationCallbacks);
    if (pWav == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_wav_init_file(pFilePath, pConfig, pAllocationCallbacks, pWav);
    if (result != MA_SUCCESS) {
        ma_free(pWav, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pWav;

    return MA_SUCCESS;
}